

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void setup_room(tgestate_t *state)

{
  room_t room_index;
  int iVar1;
  uint uVar2;
  int iVar3;
  object_t oVar4;
  uint uVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  
  memset(state->tile_buf,0,state->tile_buf_size);
  room_index = state->room_index;
  setup_doors(state);
  iVar1 = get_roomdef(state,room_index,0);
  state->roomdef_dimensions_index = (uint8_t)iVar1;
  uVar2 = get_roomdef(state,room_index,1);
  state->roomdef_object_bounds_count = (uint8_t)uVar2;
  if ((uint8_t)uVar2 == '\0') {
    iVar1 = 2;
  }
  else {
    iVar1 = (uVar2 & 0xff) * 4 + 2;
    for (lVar7 = 0; (uVar2 & 0xff) << 2 != (int)lVar7; lVar7 = lVar7 + 1) {
      iVar3 = get_roomdef(state,room_index,(int)lVar7 + 2);
      (&state->roomdef_object_bounds[0].x0)[lVar7] = (uint8_t)iVar3;
    }
  }
  iVar3 = get_roomdef(state,room_index,iVar1);
  state->interior_mask_data_count = (uint8_t)iVar3;
  lVar7 = 0;
  while( true ) {
    uVar2 = get_roomdef(state,room_index,iVar1 + 1 + (int)lVar7);
    uVar8 = (ulong)uVar2;
    if ((uint8_t)iVar3 == (uint8_t)lVar7) break;
    state->interior_mask_data[lVar7] = setup_room::interior_mask_data_source[uVar8 & 0xff];
    lVar7 = lVar7 + 1;
  }
  iVar1 = iVar1 + (int)lVar7 + 2;
  while (cVar6 = (char)uVar8, uVar8 = (ulong)(byte)(cVar6 - 1), cVar6 != '\0') {
    oVar4 = get_roomdef(state,room_index,iVar1);
    uVar2 = get_roomdef(state,room_index,iVar1 + 1);
    uVar5 = get_roomdef(state,room_index,iVar1 + 2);
    expand_object(state,oVar4 & 0xff,
                  state->tile_buf + (int)((uVar2 & 0xff) + (uVar5 & 0xff) * state->columns));
    iVar1 = iVar1 + 3;
  }
  return;
}

Assistant:

void setup_room(tgestate_t *state)
{
  /**
   * $EA7C: Interior masking data.
   *
   * Conv: Constant final (pos.height) byte added into this data.
   */
  static const mask_t interior_mask_data_source[47] =
  {
    { 27, { 123, 127, 241, 243 }, { 54, 40, 32 } },
    { 27, { 119, 123, 243, 245 }, { 54, 24, 32 } },
    { 27, { 124, 128, 241, 243 }, { 50, 42, 32 } },
    { 25, { 131, 134, 242, 247 }, { 24, 36, 32 } },
    { 25, { 129, 132, 244, 249 }, { 24, 26, 32 } },
    { 25, { 129, 132, 243, 248 }, { 28, 23, 32 } },
    { 25, { 131, 134, 244, 248 }, { 22, 32, 32 } },
    { 24, { 125, 128, 244, 249 }, { 24, 26, 32 } },
    { 24, { 123, 126, 243, 248 }, { 34, 26, 32 } },
    { 24, { 121, 124, 244, 249 }, { 34, 16, 32 } },
    { 24, { 123, 126, 244, 249 }, { 28, 23, 32 } },
    { 24, { 121, 124, 241, 246 }, { 44, 30, 32 } },
    { 24, { 125, 128, 242, 247 }, { 36, 34, 32 } },
    { 29, { 127, 130, 246, 247 }, { 28, 30, 32 } },
    { 29, { 130, 133, 242, 243 }, { 35, 48, 32 } },
    { 29, { 134, 137, 242, 243 }, { 28, 55, 32 } },
    { 29, { 134, 137, 244, 245 }, { 24, 48, 32 } },
    { 29, { 128, 131, 241, 242 }, { 40, 48, 32 } },
    { 28, { 129, 130, 244, 246 }, { 28, 32, 32 } },
    { 28, { 131, 132, 244, 246 }, { 28, 46, 32 } },
    { 26, { 126, 128, 245, 247 }, { 28, 32, 32 } },
    { 18, { 122, 123, 242, 243 }, { 58, 40, 32 } },
    { 18, { 122, 123, 239, 240 }, { 69, 53, 32 } },
    { 23, { 128, 133, 244, 246 }, { 28, 36, 32 } },
    { 20, { 128, 132, 243, 245 }, { 38, 40, 32 } },
    { 21, { 132, 133, 246, 247 }, { 26, 30, 32 } },
    { 21, { 126, 127, 243, 244 }, { 46, 38, 32 } },
    { 22, { 124, 133, 239, 243 }, { 50, 34, 32 } },
    { 22, { 121, 130, 240, 244 }, { 52, 26, 32 } },
    { 22, { 125, 134, 242, 246 }, { 36, 26, 32 } },
    { 16, { 118, 120, 245, 247 }, { 54, 10, 32 } },
    { 16, { 122, 124, 243, 245 }, { 54, 10, 32 } },
    { 16, { 126, 128, 241, 243 }, { 54, 10, 32 } },
    { 16, { 130, 132, 239, 241 }, { 54, 10, 32 } },
    { 16, { 134, 136, 237, 239 }, { 54, 10, 32 } },
    { 16, { 138, 140, 235, 237 }, { 54, 10, 32 } },
    { 17, { 115, 117, 235, 237 }, { 10, 48, 32 } },
    { 17, { 119, 121, 237, 239 }, { 10, 48, 32 } },
    { 17, { 123, 125, 239, 241 }, { 10, 48, 32 } },
    { 17, { 127, 129, 241, 243 }, { 10, 48, 32 } },
    { 17, { 131, 133, 243, 245 }, { 10, 48, 32 } },
    { 17, { 135, 137, 245, 247 }, { 10, 48, 32 } },
    { 16, { 132, 134, 244, 246 }, { 10, 48, 32 } }, /* BUG FIX: bound.y1 was 1 too high. */
    { 17, { 135, 137, 237, 239 }, { 10, 48, 32 } },
    { 17, { 123, 125, 243, 245 }, { 10, 10, 32 } },
    { 17, { 121, 123, 244, 246 }, { 10, 10, 32 } },
    { 15, { 136, 140, 245, 248 }, { 10, 10, 32 } },
  };

  /* Conv: Direct access to the room definition data has been removed and
   * replaced with calls to get_room_byte. */

  //const roomdef_t *proomdef; /* was HL */
  int              room_index;  /* Conv: Replaces direct access */
  int              offset;      /* Conv: Replaces direct access */
  bounds_t        *pbounds;  /* was DE */
  mask_t          *pmask;    /* was DE */
  uint8_t          count;    /* was A */
  uint8_t          iters;    /* was B */

  assert(state != NULL);

  wipe_visible_tiles(state);

  assert(state->room_index < room__LIMIT);
  room_index = state->room_index; /* local cached copy */
  offset     = 0;

  setup_doors(state);

  state->roomdef_dimensions_index = get_roomdef(state, room_index, offset++);

  /* Copy boundaries into state. */
  state->roomdef_object_bounds_count = count = get_roomdef(state, room_index, offset); /* count of boundaries */
  assert(count <= MAX_ROOMDEF_OBJECT_BOUNDS);
  pbounds = &state->roomdef_object_bounds[0]; /* Conv: Moved */
  if (count == 0) /* no boundaries */
  {
    offset++; /* skip to interior mask */
  }
  else
  {
    uint8_t     *p; /* so we can access bounds as bytes */
    unsigned int c; /* */

    offset++; /* Conv: Don't re-copy already copied count byte. */
    p = &pbounds->x0;
    for (c = 0; c < count * sizeof(bounds_t); c++)
      *p++ = get_roomdef(state, room_index, offset++);
    /* arrive at interior mask */
  }

  /* Copy interior mask into state->interior_mask_data. */
  state->interior_mask_data_count = iters = get_roomdef(state, room_index, offset++); /* count of interior masks */
  assert(iters <= MAX_INTERIOR_MASK_REFS);
  pmask = &state->interior_mask_data[0]; /* Conv: Moved */
  while (iters--)
  {
    uint8_t index;

    index = get_roomdef(state, room_index, offset++);
    /* Conv: Structures were changed from 7 to 8 bytes wide. */
    memcpy(pmask, &interior_mask_data_source[index], sizeof(*pmask));
    pmask++;
  }

  /* Plot all objects (as tiles). */
  iters = get_roomdef(state, room_index, offset++); /* Count of objects */
  while (iters--)
  {
    uint8_t object_index;
    uint8_t column;
    uint8_t row;

    object_index = get_roomdef(state, room_index, offset++);
    column       = get_roomdef(state, room_index, offset++);
    row          = get_roomdef(state, room_index, offset++);

    expand_object(state, object_index, &state->tile_buf[row * state->columns + column]);
  }
}